

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

int rehash(stmm_table *table)

{
  int iVar1;
  int iVar2;
  stmm_table_entry **__ptr;
  stmm_table_entry *psVar3;
  stmm_table_entry **ppsVar4;
  int local_48;
  int local_44;
  int old_num_entries;
  int hash_val;
  int old_num_bins;
  int i;
  stmm_table_entry **old_bins;
  stmm_table_entry *next;
  stmm_table_entry *ptr;
  stmm_table *table_local;
  
  __ptr = table->bins;
  iVar1 = table->num_bins;
  iVar2 = table->num_entries;
  table->num_bins = (int)(table->grow_factor * (double)iVar1);
  if (table->num_bins % 2 == 0) {
    table->num_bins = table->num_bins + 1;
  }
  table->num_entries = 0;
  ppsVar4 = (stmm_table_entry **)malloc((long)table->num_bins << 3);
  table->bins = ppsVar4;
  if (table->bins == (stmm_table_entry **)0x0) {
    table->bins = __ptr;
    table->num_bins = iVar1;
    table->num_entries = iVar2;
    table_local._4_4_ = -10000;
  }
  else {
    for (hash_val = 0; hash_val < table->num_bins; hash_val = hash_val + 1) {
      table->bins[hash_val] = (stmm_table_entry *)0x0;
    }
    for (hash_val = 0; hash_val < iVar1; hash_val = hash_val + 1) {
      next = __ptr[hash_val];
      while (next != (stmm_table_entry *)0x0) {
        psVar3 = next->next;
        if (table->hash == stmm_ptrhash) {
          local_44 = (int)(((ulong)next->key >> 2) % (ulong)(long)table->num_bins);
        }
        else {
          if (table->hash == stmm_numhash) {
            local_48 = Abc_AbsInt((int)next->key);
            local_48 = local_48 % table->num_bins;
          }
          else {
            local_48 = (*table->hash)(next->key,table->num_bins);
          }
          local_44 = local_48;
        }
        next->next = table->bins[local_44];
        table->bins[local_44] = next;
        table->num_entries = table->num_entries + 1;
        next = psVar3;
      }
    }
    if (__ptr != (stmm_table_entry **)0x0) {
      free(__ptr);
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

static int
rehash (stmm_table *table)
{
    stmm_table_entry *ptr, *next, **old_bins;
    int i, old_num_bins, hash_val, old_num_entries;

    /* save old values */
    old_bins = table->bins;
    old_num_bins = table->num_bins;
    old_num_entries = table->num_entries;

    /* rehash */
    table->num_bins = (int) (table->grow_factor * old_num_bins);
    if (table->num_bins % 2 == 0) {
    table->num_bins += 1;
    }
    table->num_entries = 0;
    table->bins = ABC_ALLOC(stmm_table_entry *, table->num_bins);
    if (table->bins == NULL) {
    table->bins = old_bins;
    table->num_bins = old_num_bins;
    table->num_entries = old_num_entries;
    return STMM_OUT_OF_MEM;
    }
    /* initialize */
    for (i = 0; i < table->num_bins; i++) {
    table->bins[i] = 0;
    }

    /* copy data over */
    for (i = 0; i < old_num_bins; i++) {
    ptr = old_bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        hash_val = do_hash (ptr->key, table);
        ptr->next = table->bins[hash_val];
        table->bins[hash_val] = ptr;
        table->num_entries++;
        ptr = next;
    }
    }
    ABC_FREE(old_bins);

    return 1;
}